

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void DecoalesceMergedSets(ExpressionContext *ctx,VmFunction *function)

{
  VmInstruction *pVVar1;
  uint uVar2;
  VmInstruction **ppVVar3;
  VmInstruction *variable_2;
  uint i_2;
  VmInstruction *variable_1;
  uint i_1;
  VmInstruction *variable;
  VmInstruction *pVStack_160;
  uint i;
  VmInstruction *currImmediateDominator;
  undefined1 local_148 [8];
  SmallArray<VmInstruction_*,_32U> mergedSet;
  VmInstruction *next;
  VmInstruction *inst;
  VmBlock *block;
  VmFunction *function_local;
  ExpressionContext *ctx_local;
  
  for (inst = (VmInstruction *)function->firstBlock; inst != (VmInstruction *)0x0;
      inst = (VmInstruction *)(inst->arguments).little[2]) {
    next = (VmInstruction *)(inst->arguments).little[3];
    while (next != (VmInstruction *)0x0) {
      mergedSet.allocator = (Allocator *)next->nextSibling;
      if ((next->cmd == VM_INST_PHI) && (next->marker == 0)) {
        SmallArray<VmInstruction_*,_32U>::SmallArray
                  ((SmallArray<VmInstruction_*,_32U> *)local_148,ctx->allocator);
        CollectMergedSet(next,next->color,(SmallArray<VmInstruction_*,_32U> *)local_148);
        qsort((void *)local_148,(ulong)(uint)mergedSet.data,8,SortByDominancePreOrder);
        pVStack_160 = (VmInstruction *)0x0;
        variable._4_4_ = 0;
        while( true ) {
          uVar2 = SmallArray<VmInstruction_*,_32U>::size
                            ((SmallArray<VmInstruction_*,_32U> *)local_148);
          if (uVar2 <= variable._4_4_) break;
          ppVVar3 = SmallArray<VmInstruction_*,_32U>::operator[]
                              ((SmallArray<VmInstruction_*,_32U> *)local_148,variable._4_4_);
          pVVar1 = *ppVVar3;
          DeCoalesce(pVVar1,function,pVStack_160);
          variable._4_4_ = variable._4_4_ + 1;
          pVStack_160 = pVVar1;
        }
        variable_1._4_4_ = 0;
        while( true ) {
          uVar2 = SmallArray<VmInstruction_*,_32U>::size
                            ((SmallArray<VmInstruction_*,_32U> *)local_148);
          if (uVar2 <= variable_1._4_4_) break;
          ppVVar3 = SmallArray<VmInstruction_*,_32U>::operator[]
                              ((SmallArray<VmInstruction_*,_32U> *)local_148,variable_1._4_4_);
          if ((*ppVVar3)->color == 0) {
            (*ppVVar3)->marker = 0;
          }
          variable_1._4_4_ = variable_1._4_4_ + 1;
        }
        if (next->color == 0) {
          mergedSet.allocator = (Allocator *)next;
        }
        variable_2._4_4_ = 0;
        while( true ) {
          uVar2 = SmallArray<VmInstruction_*,_32U>::size
                            ((SmallArray<VmInstruction_*,_32U> *)local_148);
          if (uVar2 <= variable_2._4_4_) break;
          ppVVar3 = SmallArray<VmInstruction_*,_32U>::operator[]
                              ((SmallArray<VmInstruction_*,_32U> *)local_148,variable_2._4_4_);
          pVVar1 = *ppVVar3;
          if ((pVVar1->cmd == VM_INST_PHI) && (pVVar1->color == 0)) {
            uVar2 = function->nextColor + 1;
            function->nextColor = uVar2;
            ColorPhiWeb(pVVar1,uVar2);
          }
          variable_2._4_4_ = variable_2._4_4_ + 1;
        }
        SmallArray<VmInstruction_*,_32U>::~SmallArray((SmallArray<VmInstruction_*,_32U> *)local_148)
        ;
      }
      next = (VmInstruction *)mergedSet.allocator;
    }
  }
  return;
}

Assistant:

void DecoalesceMergedSets(ExpressionContext &ctx, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst;)
		{
			VmInstruction *next = inst->nextSibling;

			if(inst->cmd == VM_INST_PHI && inst->marker == 0)
			{
				SmallArray<VmInstruction*, 32> mergedSet(ctx.allocator);

				CollectMergedSet(inst, inst->color, mergedSet);

				// Now sort merged set in depth-first-search pre-order of the dominance tree
				qsort(mergedSet.data, mergedSet.count, sizeof(mergedSet[0]), SortByDominancePreOrder);

				VmInstruction *currImmediateDominator = NULL;

				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					DeCoalesce(variable, function, currImmediateDominator);

					currImmediateDominator = variable;
				}

				// Clear markers of uncolored variables
				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					if(variable->color == 0)
						variable->marker = 0;
				}

				// If current phi was uncolored, retry iteration
				if(inst->color == 0)
					next = inst;

				// Assign new colors to uncolored phi webs
				for(unsigned i = 0; i < mergedSet.size(); i++)
				{
					VmInstruction *variable = mergedSet[i];

					if(variable->cmd == VM_INST_PHI && variable->color == 0)
						ColorPhiWeb(variable, ++function->nextColor);
				}
			}

			inst = next;
		}
	}
}